

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPlatform.cpp
# Opt level: O3

uint8_t __thiscall
GmmLib::PlatformInfo::ValidateUnifiedAuxSurface(PlatformInfo *this,GMM_TEXTURE_INFO *Surf)

{
  anon_struct_8_45_9b07292e_for_Gpu aVar1;
  
  aVar1 = (Surf->Flags).Gpu;
  if (((ulong)aVar1 >> 0x25 & 1) != 0) {
    if (((ulong)aVar1 & 0x400800000) == 0) {
      return '\0';
    }
    if (((ulong)aVar1 & 2) == 0) {
      return '\0';
    }
    if (1 < (Surf->MSAA).NumSamples) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

uint8_t GmmLib::PlatformInfo::ValidateUnifiedAuxSurface(GMM_TEXTURE_INFO &Surf)
{
    if((Surf.Flags.Gpu.UnifiedAuxSurface) &&
       !( //--- Legitimate UnifiedAuxSurface Case ------------------------------------------
       Surf.Flags.Gpu.CCS &&
       (Surf.MSAA.NumSamples <= 1 && (Surf.Flags.Gpu.RenderTarget || Surf.Flags.Gpu.Texture))))
    {
        GMM_ASSERTDPF(0, "Invalid UnifiedAuxSurface usage!");
        return 0;
    }
    return 1;
}